

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O1

string * ApprovalTests::SystemUtils::getMachineName_abi_cxx11_(void)

{
  char *in_RDX;
  char *name;
  string *in_RDI;
  string local_50;
  string local_30;
  
  safeGetEnvForNonWindows_abi_cxx11_(&local_50,(SystemUtils *)"COMPUTERNAME",in_RDX);
  if (local_50._M_string_length == 0) {
    safeGetEnvForNonWindows_abi_cxx11_(&local_30,(SystemUtils *)"HOSTNAME",name);
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_50._M_string_length == 0) {
      ::std::__cxx11::string::_M_construct<char_const*>();
      goto LAB_00170f6b;
    }
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = local_50._M_string_length;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
LAB_00170f6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string SystemUtils::getMachineName()
    {
        auto name = safeGetEnv("COMPUTERNAME");
        if (!name.empty())
        {
            return name;
        }

        name = safeGetEnv("HOSTNAME");
        if (!name.empty())
        {
            return name;
        }

        return "Unknown Computer";
    }